

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
cfgfile::details::parser_base_t<cfgfile::qstring_trait_t>::check_parser_state_after_parsing
          (parser_base_t<cfgfile::qstring_trait_t> *this)

{
  bool bVar1;
  undefined8 uVar2;
  reference pptVar3;
  string_t *what;
  allocator<char> *in_RDI;
  string_t *in_stack_fffffffffffffe58;
  exception_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffe60;
  exception_t<cfgfile::qstring_trait_t> *this_00;
  tag_t<cfgfile::qstring_trait_t> *in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8e;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffe8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  exception_t<cfgfile::qstring_trait_t> local_131 [2];
  undefined1 local_c2;
  
  bVar1 = std::
          stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
          ::empty((stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                   *)0x119ac5);
  if (!bVar1) {
    local_c2 = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe90,
               (char *)CONCAT17(in_stack_fffffffffffffe8f,
                                CONCAT16(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88)),
               in_RDI);
    qstring_trait_t::from_ascii
              ((string *)
               CONCAT17(in_stack_fffffffffffffe8f,
                        CONCAT16(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88)));
    pptVar3 = std::
              stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
              ::top((stack<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>_>
                     *)0x119b36);
    tag_t<cfgfile::qstring_trait_t>::name(*pptVar3);
    operator+((qstring_wrapper_t *)
              CONCAT17(in_stack_fffffffffffffe8f,
                       CONCAT16(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88)),
              (qstring_wrapper_t *)in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe90,
               (char *)CONCAT17(in_stack_fffffffffffffe8f,
                                CONCAT16(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88)),
               in_RDI);
    qstring_trait_t::from_ascii
              ((string *)
               CONCAT17(in_stack_fffffffffffffe8f,
                        CONCAT16(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88)));
    operator+((qstring_wrapper_t *)
              CONCAT17(in_stack_fffffffffffffe8f,
                       CONCAT16(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe88)),
              (qstring_wrapper_t *)in_RDI);
    exception_t<cfgfile::qstring_trait_t>::exception_t
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_c2 = 0;
    __cxa_throw(uVar2,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  bVar1 = tag_t<cfgfile::qstring_trait_t>::is_mandatory
                    (*(tag_t<cfgfile::qstring_trait_t> **)(in_RDI + 8));
  if ((bVar1) &&
     (bVar1 = tag_t<cfgfile::qstring_trait_t>::is_defined(in_stack_fffffffffffffe68), !bVar1)) {
    uVar4 = 1;
    what = (string_t *)__cxa_allocate_exception(0x28);
    this_00 = local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe90,
               (char *)CONCAT17(in_stack_fffffffffffffe8f,CONCAT16(uVar4,in_stack_fffffffffffffe88))
               ,in_RDI);
    qstring_trait_t::from_ascii
              ((string *)
               CONCAT17(in_stack_fffffffffffffe8f,CONCAT16(uVar4,in_stack_fffffffffffffe88)));
    tag_t<cfgfile::qstring_trait_t>::name(*(tag_t<cfgfile::qstring_trait_t> **)(in_RDI + 8));
    operator+((qstring_wrapper_t *)
              CONCAT17(in_stack_fffffffffffffe8f,CONCAT16(uVar4,in_stack_fffffffffffffe88)),
              (qstring_wrapper_t *)in_RDI);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe90,
               (char *)CONCAT17(in_stack_fffffffffffffe8f,CONCAT16(uVar4,in_stack_fffffffffffffe88))
               ,in_RDI);
    qstring_trait_t::from_ascii
              ((string *)
               CONCAT17(in_stack_fffffffffffffe8f,CONCAT16(uVar4,in_stack_fffffffffffffe88)));
    operator+((qstring_wrapper_t *)
              CONCAT17(in_stack_fffffffffffffe8f,CONCAT16(uVar4,in_stack_fffffffffffffe88)),
              (qstring_wrapper_t *)in_RDI);
    exception_t<cfgfile::qstring_trait_t>::exception_t(this_00,what);
    __cxa_throw(what,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  return;
}

Assistant:

void check_parser_state_after_parsing()
	{
		if( !m_stack.empty() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"Still unfinished tag \"" ) + m_stack.top()->name() +
				Trait::from_ascii( "\"." ) );

		if( m_tag.is_mandatory() && !m_tag.is_defined() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined mandatory tag: \"" ) +
				m_tag.name() + Trait::from_ascii( "\"." ) );
	}